

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int FindSprite(char *sprname)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (NumUnchangedSprites <= lVar1) {
      return -1;
    }
    if (*(int *)(UnchangedSpriteNames + lVar1 * 4) == *(int *)sprname) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

static int FindSprite (const char *sprname)
{
	int i;
	DWORD nameint = *((DWORD *)sprname);

	for (i = 0; i < NumUnchangedSprites; ++i)
	{
		if (*((DWORD *)&UnchangedSpriteNames[i*4]) == nameint)
		{
			return i;
		}
	}
	return -1;
}